

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

void __thiscall soul::ASTVisitor::visitObject(ASTVisitor *this,Expression *t)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  string local_30;
  
  switch((t->super_Statement).super_ASTObject.objectType) {
  case ConcreteType:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x24];
    break;
  case SubscriptWithBrackets:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x29];
    break;
  case SubscriptWithChevrons:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x2a];
    break;
  case TypeMetaFunction:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x2b];
    break;
  case Assignment:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x10];
    break;
  case BinaryOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0xc];
    break;
  case Constant:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[10];
    break;
  case DotOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x39];
    break;
  case CallOrCast:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x11];
    break;
  case FunctionCall:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x12];
    break;
  case TypeCast:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x13];
    break;
  case PreOrPostIncOrDec:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x17];
    break;
  case InPlaceOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x18];
    break;
  case ArrayElementRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x14];
    break;
  case StructMemberRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x15];
    break;
  case ComplexMemberRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x16];
    break;
  case StructDeclaration:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x25];
    break;
  case StructDeclarationRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x26];
    break;
  case UsingDeclaration:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x27];
    break;
  case TernaryOp:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x1a];
    break;
  case UnaryOperator:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0xd];
    break;
  case QualifiedIdentifier:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x37];
    break;
  case UnqualifiedName:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x38];
    break;
  case VariableRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0xf];
    break;
  case InputEndpointRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x2e];
    break;
  case OutputEndpointRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x2f];
    break;
  case ConnectionEndpointRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x30];
    break;
  case ProcessorRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x33];
    break;
  case NamespaceRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x34];
    break;
  case ProcessorInstanceRef:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x35];
    break;
  case CommaSeparatedList:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x36];
    break;
  case ProcessorProperty:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x21];
    break;
  case WriteToEndpoint:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x20];
    break;
  case AdvanceClock:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x22];
    break;
  case StaticAssertion:
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[0x3a];
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown AST expression","")
    ;
    throwInternalCompilerError(&local_30);
  }
  (*UNRECOVERED_JUMPTABLE)();
  return;
}

Assistant:

virtual void visitObject (AST::Expression& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_EXPRESSIONS (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST expression"); break;
        }
    }